

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor-read.c
# Opt level: O0

int read_float_partial_array(coda_cursor *cursor,long offset,long length,float *dst)

{
  coda_backend cVar1;
  float *dst_local;
  long length_local;
  long offset_local;
  coda_cursor *cursor_local;
  
  cVar1 = (cursor->stack[cursor->n + -1].type)->backend;
  if (cVar1 == coda_backend_ascii) {
    cursor_local._4_4_ = coda_ascii_cursor_read_float_partial_array(cursor,offset,length,dst);
  }
  else if (cVar1 == coda_backend_binary) {
    cursor_local._4_4_ = coda_bin_cursor_read_float_partial_array(cursor,offset,length,dst);
  }
  else if (cVar1 == coda_backend_memory) {
    cursor_local._4_4_ = coda_mem_cursor_read_float_partial_array(cursor,offset,length,dst);
  }
  else if (cVar1 == coda_backend_hdf4) {
    coda_set_error(-0xb,(char *)0x0);
    cursor_local._4_4_ = -1;
  }
  else if (cVar1 == coda_backend_hdf5) {
    coda_set_error(-0xd,(char *)0x0);
    cursor_local._4_4_ = -1;
  }
  else if (cVar1 == coda_backend_cdf) {
    cursor_local._4_4_ = coda_cdf_cursor_read_float_partial_array(cursor,offset,length,dst);
  }
  else if (cVar1 == coda_backend_netcdf) {
    cursor_local._4_4_ = coda_netcdf_cursor_read_float_partial_array(cursor,offset,length,dst);
  }
  else {
    if (cVar1 != coda_backend_grib) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor-read.c"
                    ,0x68a,"int read_float_partial_array(const coda_cursor *, long, long, float *)")
      ;
    }
    cursor_local._4_4_ = coda_grib_cursor_read_float_partial_array(cursor,offset,length,dst);
  }
  return cursor_local._4_4_;
}

Assistant:

static int read_float_partial_array(const coda_cursor *cursor, long offset, long length, float *dst)
{
    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
            return coda_ascii_cursor_read_float_partial_array(cursor, offset, length, dst);
        case coda_backend_binary:
            return coda_bin_cursor_read_float_partial_array(cursor, offset, length, dst);
        case coda_backend_memory:
            return coda_mem_cursor_read_float_partial_array(cursor, offset, length, dst);
        case coda_backend_hdf4:
#ifdef HAVE_HDF4
            return coda_hdf4_cursor_read_float_partial_array(cursor, offset, length, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF4_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_hdf5:
#ifdef HAVE_HDF5
            return coda_hdf5_cursor_read_float_partial_array(cursor, offset, length, dst);
#else
            coda_set_error(CODA_ERROR_NO_HDF5_SUPPORT, NULL);
            return -1;
#endif
        case coda_backend_cdf:
            return coda_cdf_cursor_read_float_partial_array(cursor, offset, length, dst);
        case coda_backend_netcdf:
            return coda_netcdf_cursor_read_float_partial_array(cursor, offset, length, dst);
        case coda_backend_grib:
            return coda_grib_cursor_read_float_partial_array(cursor, offset, length, dst);
    }

    assert(0);
    exit(1);
}